

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CRotationZ<std::complex<float>_>::CRotationZ
          (CRotationZ<std::complex<float>_> *this,int control,int target,real_type cos,real_type sin
          ,int controlState)

{
  RotationZ<std::complex<float>_> *pRVar1;
  
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00526408;
  pRVar1 = (RotationZ<std::complex<float>_> *)operator_new(0x18);
  *(undefined ***)
   &(pRVar1->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_> =
       &PTR_nbQubits_0051f660;
  *(int *)((long)&(pRVar1->super_QRotationGate1<std::complex<float>_>).
                  super_QGate1<std::complex<float>_> + 8) = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                  ,0x21,
                  "qclab::qgates::QGate1<std::complex<float>>::QGate1(const int) [T = std::complex<float>]"
                 );
  }
  *(undefined1 *)
   ((long)&(pRVar1->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_> +
   0xc) = 0;
  (pRVar1->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_ = cos;
  *(real_type *)((long)&(pRVar1->super_QRotationGate1<std::complex<float>_>).rotation_ + 4) = sin;
  *(undefined ***)
   &(pRVar1->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_> =
       &PTR_nbQubits_00522ca8;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_false>._M_head_impl =
       pRVar1;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationZ.hpp"
                  ,0x52,
                  "qclab::qgates::CRotationZ<std::complex<float>>::CRotationZ(const int, const int, const real_type, real_type, const int) [T = std::complex<float>]"
                 );
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationZ.hpp"
                ,0x51,
                "qclab::qgates::CRotationZ<std::complex<float>>::CRotationZ(const int, const int, const real_type, real_type, const int) [T = std::complex<float>]"
               );
}

Assistant:

CRotationZ( const int control , const int target ,
                    const real_type cos , real_type sin ,
                    const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< RotationZ< T > >( target , cos , sin ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }